

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.h
# Opt level: O2

QPartialOrdering pointerCompare(Private *d1,Private *d2)

{
  CompareUnderlyingType CVar1;
  
  if ((d1->field_0x18 & 1) != 0) {
    d1 = (Private *)
         ((long)&(((d1->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                 ._q_value.super___atomic_base<int>._M_i + (long)((d1->data).shared)->offset);
  }
  if ((d2->field_0x18 & 1) != 0) {
    d2 = (Private *)
         ((long)&(((d2->data).shared)->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
                 ._q_value.super___atomic_base<int>._M_i + (long)((d2->data).shared)->offset);
  }
  CVar1 = -1;
  if ((d2->data).shared <= (d1->data).shared) {
    CVar1 = (d2->data).shared < (d1->data).shared;
  }
  return (QPartialOrdering)CVar1;
}

Assistant:

const void *storage() const
        { return is_shared ? data.shared->data() : &data.data; }